

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O1

int duckdb::History::Add(char *line,idx_t len)

{
  char cVar1;
  undefined8 *__dest;
  bool bVar2;
  int iVar3;
  char *ptr;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  FILE *__stream;
  long lVar7;
  size_t __size;
  
  if (history == (undefined8 *)0x0) {
    __size = history_max_len << 3;
    history = (undefined8 *)malloc(__size);
    if (history == (undefined8 *)0x0) {
      return 0;
    }
    switchD_00570541::default(history,0,__size);
  }
  if ((history_len != 0) && (iVar3 = strcmp((char *)history[history_len + -1],line), iVar3 == 0)) {
    return 0;
  }
  bVar2 = Utf8Proc::IsValid(line,len);
  if (!bVar2) {
    return 0;
  }
  bVar2 = Terminal::IsMultiline();
  if (bVar2) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      cVar1 = line[lVar7];
      if (cVar1 == '\r') {
        if (line[lVar7 + 1] != '\n') goto LAB_0021fcac;
        lVar7 = lVar7 + 1;
      }
      else {
        if (cVar1 == '\0') goto LAB_0021fcf3;
LAB_0021fcac:
        lVar6 = lVar6 + (ulong)(cVar1 == '\n');
      }
      lVar7 = lVar7 + 1;
    } while( true );
  }
  pcVar5 = strdup(line);
  pcVar4 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return 0;
  }
  do {
    cVar1 = *pcVar4;
    if ((cVar1 == '\n') || (cVar1 == '\r')) {
      *pcVar4 = ' ';
    }
    else if (cVar1 == '\0') goto LAB_0021fd47;
    pcVar4 = pcVar4 + 1;
  } while( true );
LAB_0021fcf3:
  pcVar5 = (char *)malloc(lVar7 + lVar6 + 1);
  lVar6 = 0;
  lVar7 = 0;
  do {
    cVar1 = line[lVar6];
    if (cVar1 == '\n') {
LAB_0021fd2b:
      pcVar5[lVar7] = '\r';
      lVar7 = lVar7 + 1;
    }
    else if (cVar1 == '\r') {
      if (line[lVar6 + 1] == '\n') {
        lVar6 = lVar6 + 1;
        goto LAB_0021fd2b;
      }
    }
    else if (cVar1 == '\0') break;
    pcVar5[lVar7] = line[lVar6];
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 1;
  } while( true );
  pcVar5[lVar7] = '\0';
LAB_0021fd47:
  lVar7 = history_len;
  __dest = history;
  lVar6 = history_max_len;
  if (history_len == history_max_len) {
    free((void *)*history);
    memmove(__dest,__dest + 1,lVar6 * 8 - 8);
    history_len = lVar7 + -1;
  }
  history[history_len] = pcVar5;
  history_len = history_len + 1;
  if (history_file == (char *)0x0) {
    return 1;
  }
  if (*line == '\0') {
    return 1;
  }
  __stream = fopen(history_file,"a");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s\n",line);
    fclose(__stream);
    return 1;
  }
  return 1;
}

Assistant:

int History::Add(const char *line, idx_t len) {
	char *linecopy;

	if (history_max_len == 0) {
		return 0;
	}

	/* Initialization on first call. */
	if (history == nullptr) {
		history = (char **)malloc(sizeof(char *) * history_max_len);
		if (history == nullptr) {
			return 0;
		}
		memset(history, 0, (sizeof(char *) * history_max_len));
	}

	/* Don't add duplicated lines. */
	if (history_len && !strcmp(history[history_len - 1], line)) {
		return 0;
	}

	if (!Utf8Proc::IsValid(line, len)) {
		// don't add invalid UTF8 to history
		return 0;
	}

	/* Add an heap allocated copy of the line in the history.
	 * If we reached the max length, remove the older line. */
	if (!Terminal::IsMultiline()) {
		// replace all newlines with spaces
		linecopy = strdup(line);
		if (!linecopy) {
			return 0;
		}
		for (auto ptr = linecopy; *ptr; ptr++) {
			if (*ptr == '\n' || *ptr == '\r') {
				*ptr = ' ';
			}
		}
	} else {
		// replace all '\n' with '\r\n'
		idx_t replaced_newline_count = 0;
		idx_t len;
		for (len = 0; line[len]; len++) {
			if (line[len] == '\r' && line[len + 1] == '\n') {
				// \r\n - skip past the \n
				len++;
			} else if (line[len] == '\n') {
				replaced_newline_count++;
			}
		}
		linecopy = (char *)malloc((len + replaced_newline_count + 1) * sizeof(char));
		idx_t pos = 0;
		for (len = 0; line[len]; len++) {
			if (line[len] == '\r' && line[len + 1] == '\n') {
				// \r\n - skip past the \n
				linecopy[pos++] = '\r';
				len++;
			} else if (line[len] == '\n') {
				linecopy[pos++] = '\r';
			}
			linecopy[pos++] = line[len];
		}
		linecopy[pos] = '\0';
	}
	if (history_len == history_max_len) {
		free(history[0]);
		memmove(history, history + 1, sizeof(char *) * (history_max_len - 1));
		history_len--;
	}
	history[history_len] = linecopy;
	history_len++;
	if (history_file && strlen(line) > 0) {
		// if there is a history file that we loaded from
		// append to the history
		// this way we can recover history in case of a crash
		FILE *fp;

		fp = fopen(history_file, "a");
		if (fp == nullptr) {
			return 1;
		}
		fprintf(fp, "%s\n", line);
		fclose(fp);
	}
	return 1;
}